

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

void __thiscall duckdb::LikeMatcher::~LikeMatcher(LikeMatcher *this)

{
  pointer pcVar1;
  
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__LikeMatcher_019b2c40;
  ::std::vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>::~vector
            (&(this->segments).
              super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>);
  pcVar1 = (this->like_pattern)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->like_pattern).field_2) {
    operator_delete(pcVar1);
  }
  FunctionData::~FunctionData(&this->super_FunctionData);
  operator_delete(this);
  return;
}

Assistant:

LikeMatcher(string like_pattern_p, vector<LikeSegment> segments, bool has_start_percentage, bool has_end_percentage)
	    : like_pattern(std::move(like_pattern_p)), segments(std::move(segments)),
	      has_start_percentage(has_start_percentage), has_end_percentage(has_end_percentage) {
	}